

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadCurves(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  HairSetNode *pHVar4;
  size_t sVar5;
  XMLLoader *siglen;
  reference pvVar6;
  reference pvVar7;
  char *__nptr;
  int in_ECX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  string tessellation_rate;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  iterator __end2;
  iterator __begin2;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range2;
  size_t i_22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curveid;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Ref<embree::XML> dnormals;
  size_t i_17;
  Ref<embree::XML> animation_3;
  Ref<embree::XML> tangents;
  size_t i_12;
  Ref<embree::XML> animation_2;
  Ref<embree::XML> normals;
  size_t i_7;
  Ref<embree::XML> animation_1;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::HairSetNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_21;
  size_t i_20;
  size_t i_19;
  size_t i_18;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_16;
  size_t i_15;
  size_t i_14;
  size_t i_13;
  size_t i_5;
  size_t i_4;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_ffffffffffffefd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe0;
  string *in_stack_ffffffffffffefe8;
  XML *in_stack_ffffffffffffeff0;
  size_type in_stack_ffffffffffffeff8;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffff000;
  size_type in_stack_fffffffffffff008;
  undefined4 in_stack_fffffffffffff010;
  undefined4 in_stack_fffffffffffff014;
  XML *in_stack_fffffffffffff018;
  undefined7 in_stack_fffffffffffff020;
  undefined1 in_stack_fffffffffffff027;
  XML *this_00;
  undefined4 in_stack_fffffffffffff080;
  value_type in_stack_fffffffffffff084;
  XMLLoader *in_stack_fffffffffffff088;
  XMLLoader *this_01;
  undefined8 in_stack_fffffffffffff090;
  RTCGeometryType type_00;
  HairSetNode *in_stack_fffffffffffff098;
  BBox1f in_stack_fffffffffffff0a0;
  avector<Vec3ff> *positions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_00;
  size_t in_stack_fffffffffffff0c0;
  allocator *paVar8;
  XML *in_stack_fffffffffffff0c8;
  Ref<embree::XML> *in_stack_fffffffffffff170;
  undefined7 in_stack_fffffffffffff178;
  undefined1 in_stack_fffffffffffff17f;
  Ref<embree::XML> *in_stack_fffffffffffff1f0;
  XMLLoader *in_stack_fffffffffffff1f8;
  Ref<embree::XML> *in_stack_fffffffffffff2a0;
  XMLLoader *in_stack_fffffffffffff2a8;
  undefined1 local_b71 [33];
  string local_b50 [40];
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_b28;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_b20;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_b18;
  allocator local_b09;
  string local_b08 [32];
  long *local_ae8 [4];
  value_type local_ac8;
  XMLLoader *local_ac0;
  undefined4 local_ab8;
  allocator local_ab1;
  string local_ab0 [32];
  long *local_a90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a88;
  allocator local_a69;
  string local_a68 [32];
  undefined1 local_a48 [32];
  undefined1 local_a28 [8];
  ulong local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  allocator local_a01;
  string local_a00 [32];
  long *local_9e0;
  long *local_9d8;
  undefined1 local_9d0 [8];
  ulong local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  ulong local_9b0;
  allocator local_9a1;
  string local_9a0 [32];
  long *local_980;
  undefined1 local_978 [8];
  ulong local_970;
  undefined8 local_968;
  undefined8 local_960;
  allocator local_951;
  string local_950 [32];
  long *local_930;
  long *local_928;
  undefined1 local_920 [8];
  ulong local_918;
  undefined8 local_910;
  undefined8 local_908;
  ulong local_900;
  allocator local_8f1;
  string local_8f0 [32];
  long *local_8d0;
  undefined1 local_8c8 [8];
  ulong local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  allocator local_8a1;
  string local_8a0 [32];
  long *local_880;
  long *local_878;
  undefined1 local_870 [8];
  ulong local_868;
  undefined8 local_860;
  undefined8 local_858;
  ulong local_850;
  allocator local_841;
  string local_840 [32];
  long *local_820;
  allocator local_811;
  string local_810 [32];
  long *local_7f0;
  undefined1 local_7e8 [8];
  ulong local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [32];
  long *local_778;
  undefined1 local_770 [8];
  ulong local_768;
  undefined8 local_760;
  undefined8 local_758;
  long *local_750;
  undefined1 local_748 [8];
  ulong local_740;
  undefined8 local_738;
  undefined8 local_730;
  ulong local_728;
  allocator local_719;
  string local_718 [32];
  long *local_6f8;
  undefined1 local_6e9;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  long *local_6d8;
  HairSetNode *local_6d0 [3];
  allocator local_6b1;
  string local_6b0 [32];
  long *local_690;
  long *local_688;
  int local_67c;
  undefined8 *local_678;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  long **local_5e8;
  long **local_5e0;
  long **local_5d8;
  long **local_5d0;
  long **local_5c8;
  long **local_5c0;
  long **local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a0;
  undefined1 *local_590;
  undefined1 *local_580;
  undefined1 *local_570;
  undefined1 *local_560;
  undefined1 *local_550;
  undefined1 *local_540;
  undefined1 *local_530;
  long **local_520;
  long **local_510;
  long **local_500;
  long **local_4f0;
  long **local_4e0;
  long **local_4d0;
  long **local_4c0;
  long **local_4b0;
  long **local_4a0;
  long **local_490;
  long **local_480;
  long **local_470;
  long **local_460;
  long **local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_440;
  long **local_430;
  long **local_420;
  undefined4 *local_410;
  undefined4 *local_408;
  undefined4 *local_400;
  long **local_3f8;
  long **local_3f0;
  long **local_3e8;
  long **local_3e0;
  long **local_3d8;
  long **local_3d0;
  long **local_3c8;
  long **local_3c0;
  long **local_3b8;
  long **local_3b0;
  long **local_3a8;
  long **local_398;
  HairSetNode *local_388;
  HairSetNode **local_380;
  HairSetNode **local_378;
  HairSetNode **local_370;
  HairSetNode **local_368;
  HairSetNode **local_360;
  HairSetNode **local_358;
  HairSetNode **local_350;
  HairSetNode **local_348;
  HairSetNode **local_340;
  HairSetNode **local_338;
  HairSetNode **local_330;
  HairSetNode **local_328;
  HairSetNode **local_320;
  HairSetNode **local_318;
  HairSetNode **local_310;
  HairSetNode **local_308;
  HairSetNode **local_300;
  HairSetNode *local_2f0;
  HairSetNode **local_2e0;
  ulong local_2c0;
  undefined1 *local_2b8;
  ulong local_2a0;
  undefined1 *local_298;
  ulong local_280;
  undefined1 *local_278;
  ulong local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 *local_210;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1b0;
  ulong local_180;
  undefined1 *local_178;
  ulong local_160;
  undefined1 *local_158;
  ulong local_140;
  undefined1 *local_138;
  ulong local_120;
  undefined1 *local_118;
  ulong local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_b0;
  undefined1 *local_80;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 *local_20;
  
  type_00 = (RTCGeometryType)((ulong)in_stack_fffffffffffff090 >> 0x20);
  local_67c = in_ECX;
  local_678 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"material",&local_6b1);
  XML::child((XML *)in_stack_fffffffffffff0a0,(string *)in_stack_fffffffffffff098);
  loadMaterial(in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0);
  local_520 = &local_690;
  if (local_690 != (long *)0x0) {
    (**(code **)(*local_690 + 0x18))();
  }
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  pHVar4 = (HairSetNode *)::operator_new(0x118);
  local_6e9 = 1;
  local_3b0 = &local_6d8;
  local_3b8 = &local_688;
  local_6d8 = local_688;
  if (local_688 != (long *)0x0) {
    (**(code **)(*local_688 + 0x10))();
  }
  local_6e4 = 0;
  local_6e8 = 0x3f800000;
  local_400 = &local_6e0;
  local_408 = &local_6e4;
  local_410 = &local_6e8;
  local_6e0 = 0;
  uStack_6dc = 0x3f800000;
  SceneGraph::HairSetNode::HairSetNode
            (in_stack_fffffffffffff098,type_00,
             (Ref<embree::SceneGraph::MaterialNode> *)in_stack_fffffffffffff088,
             in_stack_fffffffffffff0a0,CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080)
            );
  local_6e9 = 0;
  local_380 = local_6d0;
  local_388 = pHVar4;
  local_6d0[0] = pHVar4;
  if (pHVar4 != (HairSetNode *)0x0) {
    (*(pHVar4->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_3a8 = &local_6d8;
  if (local_6d8 != (long *)0x0) {
    (**(code **)(*local_6d8 + 0x18))();
  }
  local_5f8 = local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"animated_positions",&local_719);
  XML::childOpt(in_stack_fffffffffffff018,
                (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  local_5b8 = &local_6f8;
  if (local_6f8 == (long *)0x0) {
    local_310 = local_6d0;
    local_600 = local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_798,"positions",&local_799);
    XML::childOpt(in_stack_fffffffffffff018,
                  (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    loadVec3ffArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff17f,in_stack_fffffffffffff178),
                    in_stack_fffffffffffff170);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    local_560 = local_770;
    for (local_120 = 0; local_120 < local_768; local_120 = local_120 + 1) {
    }
    local_118 = local_560;
    local_b0 = local_560;
    alignedFree(in_stack_ffffffffffffefd8);
    local_758 = 0;
    local_760 = 0;
    local_768 = 0;
    local_500 = &local_778;
    if (local_778 != (long *)0x0) {
      (**(code **)(*local_778 + 0x18))();
    }
    std::__cxx11::string::~string(local_798);
    std::allocator<char>::~allocator((allocator<char> *)&local_799);
    local_608 = local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"positions2",&local_7c1);
    bVar2 = XML::hasChild(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    if (bVar2) {
      local_318 = local_6d0;
      local_610 = local_678;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_810,"positions2",&local_811);
      XML::childOpt(in_stack_fffffffffffff018,
                    (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
      loadVec3ffArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff17f,in_stack_fffffffffffff178),
                      in_stack_fffffffffffff170);
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      local_550 = local_7e8;
      for (local_140 = 0; local_140 < local_7e0; local_140 = local_140 + 1) {
      }
      local_138 = local_550;
      local_80 = local_550;
      alignedFree(in_stack_ffffffffffffefd8);
      local_7d0 = 0;
      local_7d8 = 0;
      local_7e0 = 0;
      local_4f0 = &local_7f0;
      if (local_7f0 != (long *)0x0) {
        (**(code **)(*local_7f0 + 0x18))();
      }
      std::__cxx11::string::~string(local_810);
      std::allocator<char>::~allocator((allocator<char> *)&local_811);
    }
  }
  else {
    local_728 = 0;
    while( true ) {
      uVar1 = local_728;
      local_3c0 = &local_6f8;
      sVar5 = XML::size((XML *)0x395a60);
      if (sVar5 <= uVar1) break;
      local_308 = local_6d0;
      local_3c8 = &local_6f8;
      XML::child(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
      loadVec3ffArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff17f,in_stack_fffffffffffff178),
                      in_stack_fffffffffffff170);
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      local_570 = local_748;
      for (local_100 = 0; local_100 < local_740; local_100 = local_100 + 1) {
      }
      local_f0 = local_738;
      local_e8 = local_730;
      local_f8 = local_570;
      local_e0 = local_570;
      alignedFree(in_stack_ffffffffffffefd8);
      local_730 = 0;
      local_738 = 0;
      local_740 = 0;
      local_510 = &local_750;
      if (local_750 != (long *)0x0) {
        (**(code **)(*local_750 + 0x18))();
      }
      local_728 = local_728 + 1;
    }
  }
  local_4e0 = &local_6f8;
  if (local_6f8 != (long *)0x0) {
    (**(code **)(*local_6f8 + 0x18))();
  }
  local_618 = local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"animated_normals",&local_841);
  XML::childOpt(in_stack_fffffffffffff018,
                (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  local_5c0 = &local_820;
  if (local_820 == (long *)0x0) {
    local_620 = local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8a0,"normals",&local_8a1);
    XML::childOpt(in_stack_fffffffffffff018,
                  (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    std::__cxx11::string::~string(local_8a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
    local_5c8 = &local_880;
    if (local_880 != (long *)0x0) {
      local_328 = local_6d0;
      loadVec3faArray(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_ffffffffffffefe0,(value_type *)in_stack_ffffffffffffefd8);
      local_5a0 = local_8c8;
      for (local_280 = 0; local_280 < local_8c0; local_280 = local_280 + 1) {
      }
      local_278 = local_5a0;
      local_210 = local_5a0;
      alignedFree(in_stack_ffffffffffffefd8);
      local_8b0 = 0;
      local_8b8 = 0;
      local_8c0 = 0;
    }
    local_4c0 = &local_880;
    if (local_880 != (long *)0x0) {
      (**(code **)(*local_880 + 0x18))();
    }
  }
  else {
    local_850 = 0;
    while( true ) {
      uVar1 = local_850;
      local_3d0 = &local_820;
      sVar5 = XML::size((XML *)0x3968df);
      if (sVar5 <= uVar1) break;
      local_320 = local_6d0;
      local_3d8 = &local_820;
      XML::child(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
      loadVec3faArray(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_ffffffffffffefe0,(value_type *)in_stack_ffffffffffffefd8);
      local_5b0 = local_870;
      for (local_260 = 0; local_260 < local_868; local_260 = local_260 + 1) {
      }
      local_250 = local_860;
      local_248 = local_858;
      local_258 = local_5b0;
      local_240 = local_5b0;
      alignedFree(in_stack_ffffffffffffefd8);
      local_858 = 0;
      local_860 = 0;
      local_868 = 0;
      local_4d0 = &local_878;
      if (local_878 != (long *)0x0) {
        (**(code **)(*local_878 + 0x18))();
      }
      local_850 = local_850 + 1;
    }
  }
  local_4b0 = &local_820;
  if (local_820 != (long *)0x0) {
    (**(code **)(*local_820 + 0x18))();
  }
  if (((local_67c == 0x29) || (local_67c == 0x28)) || (local_67c == 0x2a)) {
    local_628 = local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f0,"animated_tangents",&local_8f1);
    XML::childOpt(in_stack_fffffffffffff018,
                  (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    std::__cxx11::string::~string(local_8f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    local_5d0 = &local_8d0;
    if (local_8d0 == (long *)0x0) {
      local_630 = local_678;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,"tangents",&local_951);
      XML::childOpt(in_stack_fffffffffffff018,
                    (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
      local_5d8 = &local_930;
      if (local_930 != (long *)0x0) {
        local_338 = local_6d0;
        loadVec3ffArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff17f,in_stack_fffffffffffff178),
                        in_stack_fffffffffffff170);
        std::
        vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
        local_530 = local_978;
        for (local_180 = 0; local_180 < local_970; local_180 = local_180 + 1) {
        }
        local_178 = local_530;
        local_20 = local_530;
        alignedFree(in_stack_ffffffffffffefd8);
        local_960 = 0;
        local_968 = 0;
        local_970 = 0;
      }
      local_490 = &local_930;
      if (local_930 != (long *)0x0) {
        (**(code **)(*local_930 + 0x18))();
      }
    }
    else {
      local_900 = 0;
      while( true ) {
        uVar1 = local_900;
        local_3e0 = &local_8d0;
        sVar5 = XML::size((XML *)0x397229);
        if (sVar5 <= uVar1) break;
        local_330 = local_6d0;
        local_3e8 = &local_8d0;
        XML::child(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
        loadVec3ffArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff17f,in_stack_fffffffffffff178),
                        in_stack_fffffffffffff170);
        std::
        vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
        local_540 = local_920;
        for (local_160 = 0; local_160 < local_918; local_160 = local_160 + 1) {
        }
        local_60 = local_910;
        local_58 = local_908;
        local_158 = local_540;
        local_50 = local_540;
        alignedFree(in_stack_ffffffffffffefd8);
        local_908 = 0;
        local_910 = 0;
        local_918 = 0;
        local_4a0 = &local_928;
        if (local_928 != (long *)0x0) {
          (**(code **)(*local_928 + 0x18))();
        }
        local_900 = local_900 + 1;
      }
    }
    local_480 = &local_8d0;
    if (local_8d0 != (long *)0x0) {
      (**(code **)(*local_8d0 + 0x18))();
    }
  }
  if (local_67c == 0x2a) {
    local_638 = local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9a0,"animated_normal_derivatives",&local_9a1);
    XML::childOpt(in_stack_fffffffffffff018,
                  (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
    std::__cxx11::string::~string(local_9a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
    local_5e0 = &local_980;
    if (local_980 == (long *)0x0) {
      local_640 = local_678;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a00,"normal_derivatives",&local_a01);
      XML::childOpt(in_stack_fffffffffffff018,
                    (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
      std::__cxx11::string::~string(local_a00);
      std::allocator<char>::~allocator((allocator<char> *)&local_a01);
      local_5e8 = &local_9e0;
      if (local_9e0 != (long *)0x0) {
        local_348 = local_6d0;
        loadVec3faArray(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     *)in_stack_ffffffffffffefe0,(value_type *)in_stack_ffffffffffffefd8);
        local_580 = local_a28;
        for (local_2c0 = 0; local_2c0 < local_a20; local_2c0 = local_2c0 + 1) {
        }
        local_2b8 = local_580;
        local_1b0 = local_580;
        alignedFree(in_stack_ffffffffffffefd8);
        local_a10 = 0;
        local_a18 = 0;
        local_a20 = 0;
      }
      local_460 = &local_9e0;
      if (local_9e0 != (long *)0x0) {
        (**(code **)(*local_9e0 + 0x18))();
      }
    }
    else {
      local_9b0 = 0;
      while( true ) {
        uVar1 = local_9b0;
        local_3f0 = &local_980;
        sVar5 = XML::size((XML *)0x397ba9);
        if (sVar5 <= uVar1) break;
        local_340 = local_6d0;
        local_3f8 = &local_980;
        XML::child(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
        loadVec3faArray(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     *)in_stack_ffffffffffffefe0,(value_type *)in_stack_ffffffffffffefd8);
        local_590 = local_9d0;
        for (local_2a0 = 0; local_2a0 < local_9c8; local_2a0 = local_2a0 + 1) {
        }
        local_1f0 = local_9c0;
        local_1e8 = local_9b8;
        local_298 = local_590;
        local_1e0 = local_590;
        alignedFree(in_stack_ffffffffffffefd8);
        local_9b8 = 0;
        local_9c0 = 0;
        local_9c8 = 0;
        local_470 = &local_9d8;
        if (local_9d8 != (long *)0x0) {
          (**(code **)(*local_9d8 + 0x18))();
        }
        local_9b0 = local_9b0 + 1;
      }
    }
    local_450 = &local_980;
    if (local_980 != (long *)0x0) {
      (**(code **)(*local_980 + 0x18))();
    }
  }
  local_648 = local_678;
  paVar8 = &local_a69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a68,"indices",paVar8);
  XML::childOpt(in_stack_fffffffffffff018,
                (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
  loadUIntArray(in_stack_fffffffffffff088,
                (Ref<embree::XML> *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
  indices_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a48;
  local_440 = indices_00;
  if ((pointer)local_a48._0_8_ != (pointer)0x0) {
    (**(code **)(*(long *)local_a48._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  local_650 = local_678;
  positions = (avector<Vec3ff> *)*local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab0,"curveid",&local_ab1);
  XML::childOpt(in_stack_fffffffffffff018,
                (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
  loadUIntArray(in_stack_fffffffffffff088,
                (Ref<embree::XML> *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
  local_430 = &local_a90;
  if (local_a90 != (long *)0x0) {
    (**(code **)(*local_a90 + 0x18))();
  }
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a48 + 8));
  local_ab8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010),in_stack_fffffffffffff008
             ,(value_type_conflict2 *)in_stack_fffffffffffff000);
  local_350 = local_6d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a48 + 8));
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  local_ac0 = (XMLLoader *)0x0;
  while (this_01 = local_ac0,
        siglen = (XMLLoader *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a48 + 8)),
        this_01 < siglen) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a48 + 8),
                        (size_type)local_ac0);
    in_stack_fffffffffffff084 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a88,(size_type)local_ac0);
    SceneGraph::HairSetNode::Hair::Hair(&local_ac8,in_stack_fffffffffffff084,*pvVar6);
    local_358 = local_6d0;
    pvVar7 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[](&local_6d0[0]->hairs,(size_type)local_ac0);
    *pvVar7 = local_ac8;
    local_ac0 = (XMLLoader *)&(local_ac0->path).filename.field_0x1;
  }
  local_658 = local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"flags",&local_b09);
  XML::childOpt(in_stack_fffffffffffff018,
                (string *)CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
  loadUCharArray(this_01,(Ref<embree::XML> *)
                         CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
  local_360 = local_6d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeff0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffefe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeff0);
  local_420 = local_ae8;
  if (local_ae8[0] != (long *)0x0) {
    (**(code **)(*local_ae8[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  if (((local_67c == 0x20) || (local_67c == 0x21)) || (local_67c == 0x22)) {
    local_368 = local_6d0;
    local_b18 = &local_6d0[0]->positions;
    local_b20._M_current =
         (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
         std::
         vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  *)in_stack_ffffffffffffefd8);
    local_b28 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       *)in_stack_ffffffffffffefd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                               *)in_stack_ffffffffffffefe0,
                              (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                               *)in_stack_ffffffffffffefd8), bVar2) {
      local_b50._32_8_ =
           __gnu_cxx::
           __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
           ::operator*(&local_b20);
      fix_bspline_end_points(indices_00,positions);
      __gnu_cxx::
      __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
      ::operator++(&local_b20);
    }
  }
  local_660 = local_678;
  this_00 = (XML *)local_b71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b71 + 1),"tessellation_rate",(allocator *)this_00);
  XML::parm(this_00,(string *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
  std::__cxx11::string::~string((string *)(local_b71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b71);
  ctx = (EVP_PKEY_CTX *)0x55b31a;
  bVar2 = std::operator!=(in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8);
  sig = extraout_RDX;
  if (bVar2) {
    __nptr = (char *)std::__cxx11::string::c_str();
    uVar3 = atoi(__nptr);
    local_370 = local_6d0;
    siglen = (XMLLoader *)(ulong)uVar3;
    local_6d0[0]->tessellation_rate = uVar3;
    sig = extraout_RDX_00;
  }
  local_378 = local_6d0;
  SceneGraph::HairSetNode::verify(local_6d0[0],ctx,sig,(size_t)siglen,in_R8,in_R9);
  local_300 = local_6d0;
  local_2f0 = local_6d0[0];
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_6d0[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string(local_b50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeff0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeff0);
  local_2e0 = local_6d0;
  if (local_6d0[0] != (HairSetNode *)0x0) {
    (*(local_6d0[0]->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_398 = &local_688;
  if (local_688 != (long *)0x0) {
    (**(code **)(*local_688 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadCurves(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) {
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
      }
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    if (type == RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_tangents")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->tangents.push_back(loadVec3ffArray(animation->child(i)));
        }
      } else if (Ref<XML> tangents = xml->childOpt("tangents")) {
        mesh->tangents.push_back(loadVec3ffArray(tangents));
      }
    }

    if (type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_normal_derivatives")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->dnormals.push_back(loadVec3faArray(animation->child(i)));
        }
      } else if (Ref<XML> dnormals = xml->childOpt("normal_derivatives")) {
        mesh->dnormals.push_back(loadVec3faArray(dnormals));
      }
    }

    std::vector<unsigned> indices = loadUIntArray(xml->childOpt("indices"));
    std::vector<unsigned> curveid = loadUIntArray(xml->childOpt("curveid"));
    curveid.resize(indices.size(),0);
    mesh->hairs.resize(indices.size());
    for (size_t i=0; i<indices.size(); i++) {
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i],
                                                     curveid[i]);
    }

    mesh->flags = loadUCharArray(xml->childOpt("flags"));
    
    if (type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE)
    {
      for (auto& vertices : mesh->positions)
        fix_bspline_end_points(indices,vertices);
    }

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }